

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O2

void stl_reader::stl_reader_impl::
     RemoveDoubles<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<double,_std::allocator<double>_> *uniqueCoordsOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *trisInOut,
               vector<double,_std::allocator<double>_> *normalsInOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *solidsInOut,
               vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
               *coordsWithIndexInOut)

{
  pointer pCVar1;
  pointer pdVar2;
  pointer pCVar3;
  pointer puVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  bool bVar6;
  index_t j_1;
  pointer puVar7;
  size_t i;
  ulong uVar8;
  pointer puVar9;
  pointer pCVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong __new_size;
  index_t j;
  int iVar15;
  index_t ni [3];
  index_t newTriInd;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndex;
  
  local_58 = normalsInOut;
  local_50 = uniqueCoordsOut;
  std::
  __sort<__gnu_cxx::__normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>*,std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((coordsWithIndexInOut->
             super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (coordsWithIndexInOut->
             super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  iVar15 = 1;
  lVar14 = 0;
  for (uVar8 = 1; pvVar5 = local_50,
      pCVar1 = (coordsWithIndexInOut->
               super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(coordsWithIndexInOut->
                            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5);
      uVar8 = uVar8 + 1) {
    bVar6 = CoordWithIndex<double,_unsigned_int>::operator!=
                      ((CoordWithIndex<double,_unsigned_int> *)((long)pCVar1[1].data + lVar14),
                       (CoordWithIndex<double,_unsigned_int> *)((long)pCVar1->data + lVar14));
    iVar15 = iVar15 + (uint)bVar6;
    lVar14 = lVar14 + 0x20;
  }
  std::vector<double,_std::allocator<double>_>::resize(local_50,(ulong)(uint)(iVar15 * 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&newIndex,
             (long)(coordsWithIndexInOut->
                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(coordsWithIndexInOut->
                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_78);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar1 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  newIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[pCVar1->index] = 0;
  pdVar2 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    pdVar2[lVar14] = pCVar1->data[lVar14];
  }
  pCVar3 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pdVar2 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 1;
  uVar12 = 0;
  pCVar10 = pCVar1;
  do {
    pCVar10 = pCVar10 + 1;
    if ((ulong)((long)pCVar3 - (long)pCVar1 >> 5) <= uVar8) {
      puVar9 = (trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      uVar12 = 0;
      puVar7 = newIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        uVar8 = (long)(trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2;
        __new_size = (ulong)uVar12;
        if (uVar8 <= uVar13) break;
        newTriInd = uVar12 / 3;
        puVar4 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (((ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78._M_impl.super__Vector_impl_data._M_start) <
             (ulong)((long)(solidsInOut->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar4)) &&
           (*(uint *)((long)puVar4 +
                     ((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78._M_impl.super__Vector_impl_data._M_start)) <= uVar13 / 3)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,&newTriInd);
          puVar9 = (trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar7 = newIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          ni[lVar14] = puVar7[puVar9[uVar13 + (int)lVar14]];
        }
        if ((ni[0] != ni[1]) && (ni[1] != ni[2] && ni[0] != ni[2])) {
          pdVar2 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
            uVar11 = (int)lVar14 + uVar12;
            puVar9[uVar11] = ni[lVar14];
            pdVar2[uVar11] = pdVar2[uVar13 + (int)lVar14];
          }
          uVar12 = uVar12 + 3;
        }
        uVar13 = uVar13 + 3;
      }
      if (__new_size < uVar8) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(trisInOut,__new_size);
        std::vector<double,_std::allocator<double>_>::resize(local_58,__new_size);
      }
      if (local_78._M_impl.super__Vector_impl_data._M_start !=
          local_78._M_impl.super__Vector_impl_data._M_finish) {
        ni[0] = uVar12 / 3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,ni);
      }
      puVar9 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar7 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = local_78._M_impl.super__Vector_impl_data._M_start;
      (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = local_78._M_impl.super__Vector_impl_data._M_finish;
      local_78._M_impl.super__Vector_impl_data._M_start = puVar7;
      local_78._M_impl.super__Vector_impl_data._M_finish = puVar4;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = puVar9;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&newIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return;
    }
    uVar13 = pCVar1[uVar8].index;
    if ((pCVar1[uVar8 - 1].data[0] != pCVar1[uVar8].data[0]) ||
       (NAN(pCVar1[uVar8 - 1].data[0]) || NAN(pCVar1[uVar8].data[0]))) {
LAB_0011cf0e:
      uVar12 = uVar12 + 1;
      for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
        pdVar2[uVar12 * 3 + (int)lVar14] = pCVar10->data[lVar14];
      }
    }
    else {
      if ((pCVar1[uVar8 - 1].data[1] != pCVar1[uVar8].data[1]) ||
         (NAN(pCVar1[uVar8 - 1].data[1]) || NAN(pCVar1[uVar8].data[1]))) goto LAB_0011cf0e;
      if ((pCVar1[uVar8 - 1].data[2] != pCVar1[uVar8].data[2]) ||
         (NAN(pCVar1[uVar8 - 1].data[2]) || NAN(pCVar1[uVar8].data[2]))) goto LAB_0011cf0e;
    }
    newIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar13] = uVar12;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void RemoveDoubles (TNumberContainer1& uniqueCoordsOut,
                      TIndexContainer1& trisInOut,
                      TNumberContainer2& normalsInOut,
                      TIndexContainer2& solidsInOut,
                      std::vector <CoordWithIndex<
                        typename TNumberContainer1::value_type,
                        typename TIndexContainer1::value_type> >
                        &coordsWithIndexInOut)
  {
    using namespace std;

    typedef typename TNumberContainer1::value_type number_t;
    typedef typename TIndexContainer1::value_type  index_t;

    sort (coordsWithIndexInOut.begin(), coordsWithIndexInOut.end());
  
  //  first count unique indices
    index_t numUnique = 1;
    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      if(coordsWithIndexInOut[i] != coordsWithIndexInOut[i - 1])
        ++numUnique;
    }

    uniqueCoordsOut.resize (numUnique * 3);
    vector<index_t> newIndex (coordsWithIndexInOut.size());

    TIndexContainer2 newSolids;

  //  copy unique coordinates to 'uniqueCoordsOut' and create an index-map
  //  'newIndex', which allows to re-index triangles later on.
    index_t curInd = 0;
    newIndex[coordsWithIndexInOut[0].index] = 0;
    for(index_t i = 0; i < 3; ++i)
      uniqueCoordsOut[i] = coordsWithIndexInOut[0][i];

    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      const CoordWithIndex <number_t, index_t> c = coordsWithIndexInOut[i];
      if(c != coordsWithIndexInOut[i - 1]){
        ++curInd;
        for(index_t j = 0; j < 3; ++j)
          uniqueCoordsOut[curInd * 3 + j] = coordsWithIndexInOut[i][j];
      }

      newIndex[c.index] = static_cast<index_t> (curInd);
    }

  //  re-index triangles, so that they refer to 'uniqueCoordsOut'
  //  make sure to only add triangles which refer to three different indices
    index_t numUniqueTriInds = 0;
    for(index_t i = 0; i < trisInOut.size(); i+=3){
      
      const index_t triInd = i / 3;
      const index_t newTriInd = numUniqueTriInds / 3;
      if (newSolids.size () < solidsInOut.size () &&
          solidsInOut [newSolids.size ()] <= triInd)
      {
        newSolids.push_back (newTriInd);
      }

      index_t ni[3];
      for(index_t j = 0; j < 3; ++j)
        ni[j] = newIndex[trisInOut[i+j]];

      if((ni[0] != ni[1]) && (ni[0] != ni[2]) && (ni[1] != ni[2])){
        for(index_t j = 0; j < 3; ++j)
        {
          trisInOut[numUniqueTriInds + j] = ni[j];
          normalsInOut[numUniqueTriInds + j] = normalsInOut [i + j];
        }
        numUniqueTriInds += 3;
      }
    }

    if(numUniqueTriInds < trisInOut.size())
    {
      trisInOut.resize (numUniqueTriInds);
      normalsInOut.resize (numUniqueTriInds);
    }

    if (!newSolids.empty ())
      newSolids.push_back (numUniqueTriInds / 3);
    
    using std::swap;
    swap (solidsInOut, newSolids);
  }